

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void __thiscall vw::predict(vw *this,multi_ex *ec)

{
  multi_learner *this_00;
  vw_exception *this_01;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  if (this->l[0xe8] != (learner<char,_char>)0x0) {
    this_00 = LEARNER::as_multiline<char,char>(this->l);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
              (this_00,ec,0);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"This reduction does not support multi-line example.");
  this_01 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
             ,0xae,&local_1c0);
  __cxa_throw(this_01,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void vw::predict(multi_ex& ec)
{
  if (!l->is_multiline)
    THROW("This reduction does not support multi-line example.");

  LEARNER::as_multiline(l)->predict(ec);
}